

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commandlineflags.h
# Opt level: O2

bool tcmalloc::commandlineflags::StringToBool(char *value,bool def)

{
  byte bVar1;
  
  if (value == (char *)0x0) {
    return def;
  }
  bVar1 = *value;
  if ((((0x25 < bVar1 - 0x54) || ((0x2100000021U >> ((ulong)(bVar1 - 0x54) & 0x3f) & 1) == 0)) &&
      (bVar1 != 0)) && (bVar1 != 0x31)) {
    return false;
  }
  return true;
}

Assistant:

inline bool StringToBool(const char *value, bool def) {
      if (!value) {
        return def;
      }
      switch (value[0]) {
      case 't':
      case 'T':
      case 'y':
      case 'Y':
      case '1':
      case '\0':
        return true;
      }
      return false;
    }